

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op_scalar_inplace<ncnn::binary_op_min<float>>(Mat *a,float b)

{
  long in_RDI;
  float fVar1;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  binary_op_min<float> op;
  float *in_stack_ffffffffffffff88;
  binary_op_min<float> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  Mat local_60;
  binary_op_min<float> *local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  local_14 = *(int *)(in_RDI + 0x1c);
  local_18 = *(int *)(in_RDI + 0x20);
  local_1c = *(int *)(in_RDI + 0x24);
  local_20 = local_14 * local_18;
  for (local_24 = 0; local_24 < local_1c; local_24 = local_24 + 1) {
    Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    in_stack_ffffffffffffff90 = (binary_op_min<float> *)Mat::operator_cast_to_float_(&local_60);
    Mat::~Mat((Mat *)0x13d6d2);
    local_30 = in_stack_ffffffffffffff90;
    for (in_stack_ffffffffffffff9c = 0; in_stack_ffffffffffffff9c < local_20;
        in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + 1) {
      fVar1 = binary_op_min<float>::operator()
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(float *)0x13d70e);
      *(float *)(local_30 + (long)in_stack_ffffffffffffff9c * 4) = fVar1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar_inplace(Mat& a, float b)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;

    #pragma omp parallel for
    for (int q=0; q<channels; q++)
    {
        float* ptr = a.channel(q);

        for (int i=0; i<size; i++)
        {
            ptr[i] = op(ptr[i], b);
        }
    }

    return 0;
}